

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

void __thiscall
DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
Clear<Memory::NoThrowHeapAllocator>
          (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
           *this,NoThrowHeapAllocator *allocator)

{
  DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar1;
  DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *obj;
  
  obj = (this->super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
        ).next.node;
  while (obj != (DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *)this)
  {
    pDVar1 = (obj->
             super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
             next.node;
    Memory::
    DeleteObject<Memory::NoThrowHeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>>>
              (allocator,obj);
    obj = pDVar1;
  }
  (this->super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next
  .list = this;
  (this->super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).prev
  .list = this;
  (this->super_RealCount).count = 0;
  return;
}

Assistant:

void Clear(TAllocator * allocator)
    {
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            AllocatorDelete(TAllocator, allocator, (Node *)current);
            current = next;
        }

        this->Next() = this;
        this->Prev() = this;
        this->SetCount(0);
    }